

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itoa.h
# Opt level: O2

char * rapidjson::internal::u32toa(uint32_t value,char *buffer)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ushort uVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (buffer == (char *)0x0) {
    __assert_fail("buffer != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/internal/itoa.h"
                  ,0x28,"char *rapidjson::internal::u32toa(uint32_t, char *)");
  }
  if (9999 < value) {
    if (99999999 < value) {
      uVar5 = (ulong)value / 100000000;
      uVar7 = (ulong)value % 100000000;
      if (value < 1000000000) {
        *buffer = (byte)uVar5 | 0x30;
        pcVar6 = buffer + 1;
      }
      else {
        *buffer = GetDigitsLut()::cDigitsLut[uVar5 * 2];
        buffer[1] = GetDigitsLut()::cDigitsLut[(ulong)(uint)((int)uVar5 * 2) + 1];
        pcVar6 = buffer + 2;
      }
      uVar4 = (ushort)(uVar7 % 10000);
      *(undefined2 *)pcVar6 = *(undefined2 *)(GetDigitsLut()::cDigitsLut + (uVar7 / 1000000) * 2);
      *(undefined2 *)(pcVar6 + 2) =
           *(undefined2 *)
            (GetDigitsLut()::cDigitsLut + (ulong)(ushort)((ushort)(uVar7 / 10000) % 100) * 2);
      *(undefined2 *)(pcVar6 + 4) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar4 / 100) * 2);
      *(undefined2 *)(pcVar6 + 6) =
           *(undefined2 *)(GetDigitsLut()::cDigitsLut + (ulong)(uVar4 % 100) * 2);
      return pcVar6 + 8;
    }
    uVar1 = (uint)(ushort)((ulong)value % 10000);
    uVar2 = (value / 1000000) * 2;
    uVar7 = (ulong)(((uint)(ushort)((ulong)value / 10000) % 100) * 2);
    uVar3 = (uVar1 / 100) * 2;
    uVar5 = (ulong)((uVar1 % 100) * 2);
    if (value < 10000000) {
      if (999999 < value) goto LAB_00139193;
      if (value < 100000) goto LAB_001391b5;
    }
    else {
      *buffer = GetDigitsLut()::cDigitsLut[uVar2];
      buffer = buffer + 1;
LAB_00139193:
      *buffer = GetDigitsLut()::cDigitsLut[(ulong)uVar2 + 1];
      buffer = buffer + 1;
    }
    *buffer = GetDigitsLut()::cDigitsLut[uVar7];
    buffer = buffer + 1;
LAB_001391b5:
    *buffer = GetDigitsLut()::cDigitsLut[uVar7 + 1];
    buffer[1] = GetDigitsLut()::cDigitsLut[uVar3];
    buffer[2] = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar3 + 1];
    buffer[3] = GetDigitsLut()::cDigitsLut[uVar5];
    buffer[4] = GetDigitsLut()::cDigitsLut[uVar5 + 1];
    return buffer + 5;
  }
  uVar1 = ((value & 0xffff) / 100) * 2;
  uVar2 = ((value & 0xffff) % 100) * 2;
  if (value < 1000) {
    if (99 < value) goto LAB_00139112;
    if (value < 10) goto LAB_00139134;
  }
  else {
    *buffer = GetDigitsLut()::cDigitsLut[uVar1];
    buffer = buffer + 1;
LAB_00139112:
    *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar1 + 1];
    buffer = buffer + 1;
  }
  *buffer = GetDigitsLut()::cDigitsLut[uVar2];
  buffer = buffer + 1;
LAB_00139134:
  *buffer = GetDigitsLut()::cDigitsLut[(ulong)(ushort)uVar2 + 1];
  return buffer + 1;
}

Assistant:

inline char* u32toa(uint32_t value, char* buffer) {
    RAPIDJSON_ASSERT(buffer != 0);

    const char* cDigitsLut = GetDigitsLut();

    if (value < 10000) {
        const uint32_t d1 = (value / 100) << 1;
        const uint32_t d2 = (value % 100) << 1;

        if (value >= 1000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 100)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 10)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
    }
    else if (value < 100000000) {
        // value = bbbbcccc
        const uint32_t b = value / 10000;
        const uint32_t c = value % 10000;

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        if (value >= 10000000)
            *buffer++ = cDigitsLut[d1];
        if (value >= 1000000)
            *buffer++ = cDigitsLut[d1 + 1];
        if (value >= 100000)
            *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];

        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    else {
        // value = aabbbbcccc in decimal

        const uint32_t a = value / 100000000; // 1 to 42
        value %= 100000000;

        if (a >= 10) {
            const unsigned i = a << 1;
            *buffer++ = cDigitsLut[i];
            *buffer++ = cDigitsLut[i + 1];
        }
        else
            *buffer++ = static_cast<char>('0' + static_cast<char>(a));

        const uint32_t b = value / 10000; // 0 to 9999
        const uint32_t c = value % 10000; // 0 to 9999

        const uint32_t d1 = (b / 100) << 1;
        const uint32_t d2 = (b % 100) << 1;

        const uint32_t d3 = (c / 100) << 1;
        const uint32_t d4 = (c % 100) << 1;

        *buffer++ = cDigitsLut[d1];
        *buffer++ = cDigitsLut[d1 + 1];
        *buffer++ = cDigitsLut[d2];
        *buffer++ = cDigitsLut[d2 + 1];
        *buffer++ = cDigitsLut[d3];
        *buffer++ = cDigitsLut[d3 + 1];
        *buffer++ = cDigitsLut[d4];
        *buffer++ = cDigitsLut[d4 + 1];
    }
    return buffer;
}